

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensus.hpp
# Opt level: O0

void __thiscall
opengv::sac::SampleConsensus<opengv::sac_problems::point_cloud::PointCloudSacProblem>::
~SampleConsensus(SampleConsensus<opengv::sac_problems::point_cloud::PointCloudSacProblem> *this)

{
  code *pcVar1;
  SampleConsensus<opengv::sac_problems::point_cloud::PointCloudSacProblem> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

opengv::sac::SampleConsensus<P>::~SampleConsensus(){}